

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O1

bool cppcms::xss::validate_and_filter_if_invalid
               (char *begin,char *end,rules *r,string *output,filtering_method_type method,
               char repl_ch)

{
  byte bVar1;
  html_data_type hVar2;
  data *pdVar3;
  pointer pcVar4;
  byte *pbVar5;
  pointer peVar6;
  pointer peVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  html_data_type *phVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  entry *peVar16;
  char *p;
  byte *pbVar17;
  ulong uVar18;
  string real_encoding;
  string filtered;
  string work_encoding;
  string work_input;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  parsed;
  string tmp;
  string filtered_input;
  string local_128;
  string *local_108;
  ulong local_100;
  char *local_f8;
  long local_f0;
  char local_e8 [16];
  string local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  long local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  local_98;
  char *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  pdVar3 = (r->d).ptr_;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  pcVar4 = (pdVar3->encoding)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,pcVar4,pcVar4 + (pdVar3->encoding)._M_string_length);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_128._M_dataplus._M_p,
             (char *)(local_128._M_string_length + (long)local_128._M_dataplus._M_p));
  local_b8 = &local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_f8 = local_e8;
  local_f0 = 0;
  local_e8[0] = '\0';
  if ((char *)local_128._M_string_length == (char *)0x0) {
    bVar8 = true;
    local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)begin;
  }
  else {
    bVar8 = encoding::is_ascii_compatible(&local_128);
    if (!bVar8) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_d8,0,(char *)local_d8._M_string_length,0x245fc1);
      booster::locale::conv::to_utf<char>
                ((char *)local_70,begin,(string *)end,(method_type)&local_128);
      std::__cxx11::string::swap((string *)&local_b8);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      end = local_b8->_M_local_buf + local_b0;
      repl_ch = '\0';
      begin = (char *)local_b8;
    }
    bVar8 = true;
    bVar9 = encoding::validate_or_filter(&local_d8,begin,end,&local_50,repl_ch);
    local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)begin;
    if (!bVar9) {
      end = local_50._M_dataplus._M_p + local_50._M_string_length;
      bVar8 = false;
      local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_50._M_dataplus._M_p;
    }
  }
  local_98.
  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  anon_unknown_8::split_to_parts(local_78->_M_local_buf,end,&local_98);
  peVar7 = local_98.
           super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  peVar6 = local_98.
           super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_100 = ((long)local_98.
                     super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_98.
                     super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  local_108 = output;
  local_80 = end;
  if (local_98.
      super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_98.
      super__Vector_base<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar11 = 0;
    uVar13 = 1;
    do {
      peVar16 = peVar6 + uVar11;
      hVar2 = peVar16->type;
      anon_unknown_8::parse_part(peVar16);
      if (hVar2 == invalid_data) {
        bVar8 = false;
      }
      if (peVar16->type == invalid_data) {
        bVar8 = false;
      }
      bVar9 = uVar13 < local_100;
      uVar11 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar9);
  }
  uVar11 = local_100;
  anon_unknown_8::validate_nesting(&local_98,((r->d).ptr_)->is_xhtml);
  if (peVar7 != peVar6) {
    phVar12 = &peVar6->type;
    uVar15 = 1;
    do {
      if (*phVar12 == invalid_data) {
        bVar8 = false;
      }
      uVar13 = (ulong)uVar15;
      phVar12 = phVar12 + 0x12;
      uVar15 = uVar15 + 1;
    } while (uVar13 < uVar11);
  }
  if (peVar7 != peVar6) {
    uVar13 = 0;
    uVar18 = 1;
    do {
      peVar16 = peVar6 + uVar13;
      bVar9 = anon_unknown_8::validate_entry_by_rules(peVar16,r);
      if (!bVar9) {
        lVar14 = (long)(peVar16->tag).pair;
        if (lVar14 != -1) {
          peVar6[lVar14].type = invalid_data;
        }
        peVar16->type = invalid_data;
        bVar8 = false;
      }
      bVar9 = uVar18 < uVar11;
      uVar13 = uVar18;
      uVar18 = (ulong)((int)uVar18 + 1);
    } while (bVar9);
  }
  if (!bVar8) {
    local_f0 = 0;
    *local_f8 = '\0';
    std::__cxx11::string::reserve((ulong)&local_f8);
    if (peVar7 != peVar6) {
      uVar11 = 0;
      do {
        pbVar17 = (byte *)peVar6[uVar11].begin;
        pbVar5 = (byte *)peVar6[uVar11].end;
        if (peVar6[uVar11].type == invalid_data) {
          if (method != remove_invalid) {
            for (; pbVar17 != pbVar5; pbVar17 = pbVar17 + 1) {
              bVar1 = *pbVar17;
              if (bVar1 < 0x3c) {
                if ((bVar1 != 0x22) && (bVar1 != 0x26)) goto LAB_0022272f;
LAB_00222743:
                std::__cxx11::string::append((char *)&local_f8);
              }
              else {
                if ((bVar1 == 0x3e) || (bVar1 == 0x3c)) goto LAB_00222743;
LAB_0022272f:
                std::__cxx11::string::push_back((char)&local_f8);
              }
            }
          }
        }
        else {
          std::__cxx11::string::append((char *)&local_f8,(ulong)pbVar17);
        }
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (uVar11 < local_100);
    }
    if ((local_d8._M_string_length == local_128._M_string_length) &&
       (((char *)local_d8._M_string_length == (char *)0x0 ||
        (iVar10 = bcmp(local_d8._M_dataplus._M_p,local_128._M_dataplus._M_p,
                       local_d8._M_string_length), iVar10 == 0)))) {
      std::__cxx11::string::swap((string *)local_108);
    }
    else {
      booster::locale::conv::from_utf<char>
                ((char *)local_70,local_f8,(string *)(local_f8 + local_f0),(method_type)&local_128);
      std::__cxx11::string::swap((string *)local_108);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
    }
  }
  std::
  vector<cppcms::xss::(anonymous_namespace)::entry,_std::allocator<cppcms::xss::(anonymous_namespace)::entry>_>
  ::~vector(&local_98);
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  return bVar8;
}

Assistant:

bool validate_and_filter_if_invalid(	char const *begin,
						char const *end,
						rules const &r,
						std::string &output,
						filtering_method_type method,
						char repl_ch)
	{
		bool valid = true;
		
		std::string real_encoding = r.encoding();
		std::string work_encoding = real_encoding;

		std::string work_input;
		std::string filtered_input;
		std::string filtered;

		if(!real_encoding.empty()) {
			if(!encoding::is_ascii_compatible(real_encoding)) { 
				work_encoding = "UTF-8";
				repl_ch = 0;
				try {
					std::string tmp = 
						booster::locale::conv::to_utf<char>(
							begin,
							end,
							real_encoding,
							booster::locale::conv::stop
							);
					work_input.swap(tmp);
				}
				catch(...) {
					valid = false;
					std::string tmp = 
						booster::locale::conv::to_utf<char>(
							begin,
							end,
							real_encoding,
							booster::locale::conv::skip
							);
					work_input.swap(tmp);
				}
				begin = work_input.c_str();
				end = begin + work_input.size();
			}

			if(!encoding::validate_or_filter(work_encoding,begin,end,filtered_input,repl_ch)) {
				valid = false;
				begin = filtered_input.c_str();
				end = begin + filtered_input.size();
			}
		}

		std::vector<entry> parsed;
		
		split_to_parts(begin,end,parsed);

		size_t size = parsed.size();

		for(unsigned i=0;i<size;i++) {
			if(parsed[i].type == invalid_data)
				valid = false;
			parse_part(parsed[i]);
			if(parsed[i].type == invalid_data)
				valid = false;
		}

		validate_nesting(parsed,r.html() == rules::xhtml_input);

		for(unsigned i=0;i<size;i++)
			if(parsed[i].type == invalid_data)
				valid = false;

		for(unsigned i=0;i<size;i++) {
			if(!validate_entry_by_rules(parsed[i],r)) {
				valid = false;
				int pair = parsed[i].tag.pair;
				if(pair!=-1)
					parsed[pair].type = invalid_data;
				parsed[i].type = invalid_data;
			}
		}
		if(valid)
			return true;
		
		filtered.clear();
		filtered.reserve(end-begin);
		
		for(unsigned i=0;i<size;i++) {
			char const *b=parsed[i].begin;
			char const *e=parsed[i].end;
			if(parsed[i].type == invalid_data) {
				if(method == remove_invalid)
					continue;
				for(char const *p=b;p!=e;p++) {
					char c=*p;
					switch(c) {
					case '<':
						filtered+="&lt;";
						break;
					case '>':
						filtered+="&gt;";
						break;
					case '&':
						filtered+="&amp;";
						break;
					case '"':
						filtered+="&quot;";
						break;
					default:
						filtered+=c;
					}
				}
			}
			else {
				filtered.append(b,e-b);
			}
		}

		if(work_encoding == real_encoding) {
			output.swap(filtered);
		}
		else {
			try {
				std::string tmp = booster::locale::conv::from_utf<char>(
						filtered,
						real_encoding,
						booster::locale::conv::stop);
				output.swap(tmp);
			}
			catch(...) {
				// Nothing to do
			}
		}
		return false;
	}